

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O3

ztast_scopearrayinner_t *
ztast_scopearrayinner_append(ztast_t *ast,ztast_scopearrayinner_t *inner,ztast_scope_t *scope)

{
  int iVar1;
  int iVar2;
  ztast_scope **__dest;
  uint uVar3;
  
  if (inner == (ztast_scopearrayinner_t *)0x0) {
    inner = (ztast_scopearrayinner_t *)(*ast->mallocfn)(0x10,ast->opaque);
    if (inner != (ztast_scopearrayinner_t *)0x0) {
      inner->nused = 0;
      inner->nallocated = 0;
      inner->scopes = (ztast_scope **)0x0;
      uVar3 = 8;
      goto LAB_001038b6;
    }
LAB_001038fe:
    inner = (ztast_scopearrayinner_t *)0x0;
  }
  else {
    iVar2 = inner->nused;
    iVar1 = inner->nallocated;
    if (iVar2 == iVar1) {
      uVar3 = 8;
      if (7 < iVar1) {
        uVar3 = iVar1 * 2;
      }
LAB_001038b6:
      __dest = (ztast_scope **)(*ast->mallocfn)((ulong)uVar3 << 3,ast->opaque);
      if (__dest == (ztast_scope **)0x0) goto LAB_001038fe;
      memcpy(__dest,inner->scopes,(long)inner->nallocated << 3);
      if (ast->freefn != (ztast_freefn_t *)0x0) {
        (*ast->freefn)(inner->scopes,ast->opaque);
      }
      inner->nallocated = uVar3;
      inner->scopes = __dest;
      iVar2 = inner->nused;
    }
    else {
      __dest = inner->scopes;
    }
    inner->nused = iVar2 + 1;
    __dest[iVar2] = scope;
  }
  return inner;
}

Assistant:

ztast_scopearrayinner_t *ztast_scopearrayinner_append(ztast_t                 *ast,
                                                      ztast_scopearrayinner_t *inner,
                                                      ztast_scope_t           *scope)
{
  assert(ast);
  /* inner may be NULL - which means allocate */
  assert(scope);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_scopearrayinner_append\n");
#endif

  if (inner == NULL)
  {
    inner = ZTAST_MALLOC(sizeof(*inner));
    if (inner == NULL)
      return NULL;

    inner->nused      = 0;
    inner->nallocated = 0;
    inner->scopes     = NULL;
  }

  if (inner->nused == inner->nallocated)
  {
    int             newarrlen;
    ztast_scope_t **newarr;

    /* This code pattern would use realloc() normally but our simple memory
     * manager doesn't currently feature it. */

    newarrlen = inner->nallocated < 8 ? 8 : inner->nallocated * 2;
    newarr = ZTAST_MALLOC(newarrlen * sizeof(*newarr));
    if (newarr == NULL)
      return NULL;
 
    memcpy(newarr, inner->scopes, inner->nallocated * sizeof(*newarr));
    ZTAST_FREE(inner->scopes);

    inner->nallocated = newarrlen;
    inner->scopes     = newarr;
  }

  inner->scopes[inner->nused++] = scope;

  return inner;
}